

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

Maybe<kj::StringTree> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepInitializer
          (Maybe<kj::StringTree> *__return_storage_ptr__,CapnpcCppMain *this,Schema type,
          CppTypeName *name)

{
  CppTypeName *value;
  StringPtr *in_R8;
  StringPtr innerName;
  undefined1 local_78 [80];
  ArrayPtr<const_char> local_28;
  
  if ((CapnpcCppMain *)(this->context + 9) == this) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    innerName.content.size_ = 0xe;
    innerName.content.ptr = "_capnpPrivate";
    CppTypeName::addMemberType((CppTypeName *)type.raw,innerName);
    local_78._0_8_ = "brand";
    local_78._8_8_ = (char *)0x6;
    kj::strTree<kj::StringTree,char_const(&)[3],kj::StringPtr&>
              ((StringTree *)(local_78 + 0x18),(kj *)type.raw,(StringTree *)0x23ffac,
               (char (*) [3])local_78,in_R8);
    kj::StringTree::operator=((StringTree *)type.raw,(StringTree *)(local_78 + 0x18));
    kj::StringTree::~StringTree((StringTree *)(local_78 + 0x18));
    *(undefined1 *)((long)&type.raw[1].dependencies + 1) = 0;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)local_78,(kj *)type.raw,value);
    local_28 = kj::toCharSequence<char_const(&)[3]>((char (*) [3])0x249092);
    kj::StringTree::concat<kj::String,kj::ArrayPtr<char_const>>
              ((StringTree *)(local_78 + 0x18),(StringTree *)local_78,(String *)&local_28,&local_28)
    ;
    kj::Array<char>::~Array((Array<char> *)local_78);
    kj::_::NullableValue<kj::StringTree>::NullableValue
              (&__return_storage_ptr__->ptr,(StringTree *)(local_78 + 0x18));
    kj::StringTree::~StringTree((StringTree *)(local_78 + 0x18));
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::StringTree> makeBrandDepInitializer(Schema type, CppTypeName name) {
    if (type.isBranded()) {
      name.addMemberType("_capnpPrivate");
      name.addMemberValue("brand");
      return kj::strTree(name, "()");
    } else {
      return nullptr;
    }
  }